

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

void libtorrent::aux::(anonymous_namespace)::
     map_port<libtorrent::upnp,libtorrent::portmap_protocol,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>
               (upnp *m,portmap_protocol protocol,basic_endpoint<boost::asio::ip::tcp> *ep,
               port_mapping_t *map_handle,string *device)

{
  ushort uVar1;
  undefined8 uVar2;
  bool bVar3;
  port_mapping_t pVar4;
  address addr;
  address local_88;
  data_union local_68;
  data_union local_48;
  
  if (map_handle->m_val != -1) {
    upnp::delete_mapping(m,(port_mapping_t)map_handle->m_val);
  }
  map_handle->m_val = -1;
  if ((ep->impl_).data_.base.sa_family == 2) {
    local_88._0_8_ = (ulong)(ep->impl_).data_.v6.sin6_flowinfo << 0x20;
    local_88.ipv6_address_.addr_.__in6_u._0_8_ = 0;
    local_88.ipv6_address_.addr_.__in6_u._8_8_ = 0;
    local_88.ipv6_address_.scope_id_ = 0;
  }
  else {
    local_88.ipv6_address_.addr_.__in6_u._0_8_ = *(undefined8 *)((long)&(ep->impl_).data_ + 8);
    local_88.ipv6_address_.addr_.__in6_u._8_8_ = *(undefined8 *)((long)&(ep->impl_).data_ + 0x10);
    local_88.ipv6_address_.scope_id_ = (unsigned_long)(ep->impl_).data_.v6.sin6_scope_id;
    local_88.type_ = ipv6;
    local_88.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
  }
  if ((local_88.type_ == ipv6) && (bVar3 = is_local(&local_88), bVar3)) {
    return;
  }
  local_48._8_4_ = 0;
  local_48._12_4_ = 0;
  local_48._16_4_ = 0;
  local_48._20_8_ = 0;
  local_48._0_8_ = 2;
  bVar3 = boost::asio::ip::operator==(ep,(basic_endpoint<boost::asio::ip::tcp> *)&local_48.base);
  if (!bVar3) {
    uVar1 = (ep->impl_).data_.v4.sin_port;
    local_68._20_8_ = *(undefined8 *)((long)&(ep->impl_).data_ + 0x14);
    local_68._16_4_ = (undefined4)((ulong)*(undefined8 *)((long)&(ep->impl_).data_ + 0xc) >> 0x20);
    local_68._0_8_ = *(undefined8 *)&(ep->impl_).data_;
    uVar2 = *(undefined8 *)((long)&(ep->impl_).data_ + 8);
    local_68._8_4_ = (undefined4)uVar2;
    local_68._12_4_ = (undefined4)((ulong)uVar2 >> 0x20);
    pVar4 = upnp::add_mapping(m,protocol,(uint)(ushort)(uVar1 << 8 | uVar1 >> 8),
                              (endpoint *)&local_68.base,device);
    map_handle->m_val = (int)pVar4;
  }
  return;
}

Assistant:

void map_port(MapProtocol& m, ProtoType protocol, EndpointType const& ep
			, port_mapping_t& map_handle, std::string const& device)
		{
			if (map_handle != port_mapping_t{-1}) m.delete_mapping(map_handle);
			map_handle = port_mapping_t{-1};

			address const addr = ep.address();
			// with IPv4 the interface might be behind NAT so we can't skip them
			// based on the scope of the local address
			if (addr.is_v6() && is_local(addr))
				return;

			// only update this mapping if we actually have a socket listening
			if (ep != EndpointType())
				map_handle = m.add_mapping(protocol, ep.port(), ep, device);
		}